

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Firework.cpp
# Opt level: O0

bool __thiscall
Firework::initializeFirework
          (Firework *this,int startX,int endY,int explosionDiameter,int streamerColor,
          int explosionColor,Screen *screen)

{
  int iVar1;
  bool bVar2;
  int explosionColor_local;
  int streamerColor_local;
  int explosionDiameter_local;
  int endY_local;
  int startX_local;
  Firework *this_local;
  
  bVar2 = this->fireworkStage == 0;
  if (bVar2) {
    this->fireworkStage = 1;
    iVar1 = Screen::getScreenSizeY(screen);
    this->currentPosition[0] = iVar1;
    this->endPosition[1] = startX;
    this->currentPosition[1] = startX;
    iVar1 = Screen::getScreenSizeY(screen);
    this->endPosition[0] = iVar1 - endY;
    this->explosionDiameter = explosionDiameter;
    this->streamerColor = streamerColor;
    this->explosionColor = explosionColor;
  }
  return bVar2;
}

Assistant:

bool Firework::initializeFirework(int startX, int endY, int explosionDiameter, int streamerColor, int explosionColor, Screen &screen) {
    // Check to see if the firework has already been initialized
    if(fireworkStage != UNITIALIZED){
        return false;
    }
    else {
        fireworkStage = STREAMER_STAGE;

        currentPosition[0] = screen.getScreenSizeY();
        currentPosition[1] = endPosition[1] = startX;

        endPosition[0] = screen.getScreenSizeY() - endY;

        this->explosionDiameter = explosionDiameter;

        this->streamerColor = streamerColor;
        this->explosionColor = explosionColor;

        return true;
    }
}